

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_sqrt_sort(int64_t *arr,size_t Len)

{
  int iVar1;
  int64_t *arr_00;
  void *__ptr;
  ulong in_RSI;
  int NK;
  int *Tags;
  int64_t *ExtBuf;
  int L;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int local_14;
  
  for (local_14 = 1; (ulong)(long)(local_14 * local_14) < in_RSI; local_14 = local_14 << 1) {
  }
  iVar1 = (int)((in_RSI - 1) / (ulong)(long)local_14) + 2;
  arr_00 = sorter_sort_new_buffer(0x10b789);
  if ((arr_00 != (int64_t *)0x0) && (__ptr = malloc((long)iVar1 << 2), __ptr != (void *)0x0)) {
    sorter_sqrt_sort_common_sort
              (arr_00,(int)((ulong)__ptr >> 0x20),
               (int64_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
    free(__ptr);
    sorter_sort_delete_buffer((int64_t *)0x10b7e4);
  }
  return;
}

Assistant:

void SQRT_SORT(SORT_TYPE *arr, size_t Len) {
  int L = 1;
  SORT_TYPE *ExtBuf;
  int *Tags;
  int NK;

  while (L * L < Len) {
    L *= 2;
  }

  NK = (int)((Len - 1) / L + 2);
  ExtBuf = SORT_NEW_BUFFER(L);

  if (ExtBuf == NULL) {
    return; /* fail */
  }

  Tags = (int *)malloc(NK * sizeof(int));

  if (Tags == NULL) {
    return;
  }

  SQRT_SORT_COMMON_SORT(arr, (int)Len, ExtBuf, Tags);
  free(Tags);
  SORT_DELETE_BUFFER(ExtBuf);
}